

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

cmSourceFile * __thiscall cmTarget::AddSource(cmTarget *this,string *src,bool before)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  const_iterator __position;
  __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var2;
  size_type sVar3;
  cmSourceFile *pcVar4;
  cmListFileBacktrace lfbt;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_b0;
  cmSourceFileLocation sfl;
  
  cmSourceFileLocation::cmSourceFileLocation
            (&sfl,((this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile,src,
             Known);
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_pred<TargetPropertyEntryFinder>>
                    (*(undefined8 *)
                      &((_Var1._M_head_impl)->SourceEntries).
                       super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ,*(pointer *)((long)&(_Var1._M_head_impl)->SourceEntries + 8),&sfl);
  if (_Var2._M_current ==
      *(pointer *)
       ((long)&((this->impl)._M_t.
                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->SourceEntries + 8)
     ) {
    cmMakefile::GetBacktrace((cmMakefile *)&lfbt);
    _Var1._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    __position._M_current =
         *(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> **)
          ((long)&(_Var1._M_head_impl)->SourceEntries + (ulong)!before * 8);
    std::__cxx11::string::string((string *)&local_d0,(string *)src);
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_e0,
                   (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    *)&lfbt);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_b0,&local_d0,(cmListFileBacktrace *)&local_e0);
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_M_insert_rval(&(_Var1._M_head_impl)->SourceEntries,__position,&local_b0);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  sVar3 = cmGeneratorExpression::Find(src);
  if (sVar3 == 0xffffffffffffffff) {
    pcVar4 = cmMakefile::GetOrCreateSource
                       (((this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile,
                        src,false,Known);
  }
  else {
    pcVar4 = (cmSourceFile *)0x0;
  }
  cmSourceFileLocation::~cmSourceFileLocation(&sfl);
  return pcVar4;
}

Assistant:

cmSourceFile* cmTarget::AddSource(const std::string& src, bool before)
{
  cmSourceFileLocation sfl(this->impl->Makefile, src,
                           cmSourceFileLocationKind::Known);
  if (std::find_if(
        this->impl->SourceEntries.begin(), this->impl->SourceEntries.end(),
        TargetPropertyEntryFinder(sfl)) == this->impl->SourceEntries.end()) {
    cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
    this->impl->SourceEntries.insert(before ? this->impl->SourceEntries.begin()
                                            : this->impl->SourceEntries.end(),
                                     BT<std::string>(src, lfbt));
  }
  if (cmGeneratorExpression::Find(src) != std::string::npos) {
    return nullptr;
  }
  return this->impl->Makefile->GetOrCreateSource(
    src, false, cmSourceFileLocationKind::Known);
}